

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O1

ma_thread_result ma_device_thread__null(void *pData)

{
  long lVar1;
  undefined1 auVar2 [16];
  timespec newTime;
  timespec local_40;
  
  if (pData == (void *)0x0) {
    __assert_fail("pDevice != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                  ,0x1d38,"ma_thread_result ma_device_thread__null(void *)");
  }
switchD_001afe92_default:
  ma_event_wait((ma_event *)((long)pData + 0xd18));
  switch(*(undefined4 *)((long)pData + 0xe38)) {
  case 0:
    goto switchD_001afe92_caseD_0;
  case 2:
    clock_gettime(1,&local_40);
    lVar1 = (local_40.tv_sec * 1000000000 + local_40.tv_nsec) - *(long *)((long)pData + 0xe40);
    auVar2._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar2._0_8_ = lVar1;
    auVar2._12_4_ = 0x45300000;
    *(double *)((long)pData + 0xe48) =
         ((auVar2._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) / 1000000000.0 +
         *(double *)((long)pData + 0xe48);
    break;
  case 3:
    *(undefined4 *)((long)pData + 0xe3c) = 0;
    ma_event_signal((ma_event *)((long)pData + 0xd78));
    ma_semaphore_release((ma_semaphore *)((long)pData + 0xdd8));
    return (ma_thread_result)0x0;
  default:
    goto switchD_001afe92_default;
  }
  clock_gettime(1,&local_40);
  *(__time_t *)((long)pData + 0xe40) = local_40.tv_sec * 1000000000 + local_40.tv_nsec;
  *(undefined4 *)((long)pData + 0xe3c) = 0;
  ma_event_signal((ma_event *)((long)pData + 0xd78));
  ma_semaphore_release((ma_semaphore *)((long)pData + 0xdd8));
  goto switchD_001afe92_default;
switchD_001afe92_caseD_0:
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                ,0x1d66,"ma_thread_result ma_device_thread__null(void *)");
}

Assistant:

static ma_thread_result MA_THREADCALL ma_device_thread__null(void* pData)
{
    ma_device* pDevice = (ma_device*)pData;
    MA_ASSERT(pDevice != NULL);

    for (;;) {  /* Keep the thread alive until the device is uninitialized. */
        ma_uint32 operation;

        /* Wait for an operation to be requested. */
        ma_event_wait(&pDevice->null_device.operationEvent);

        /* At this point an event should have been triggered. */
        operation = pDevice->null_device.operation;

        /* Starting the device needs to put the thread into a loop. */
        if (operation == MA_DEVICE_OP_START__NULL) {
            /* Reset the timer just in case. */
            ma_timer_init(&pDevice->null_device.timer);

            /* Getting here means a suspend or kill operation has been requested. */
            pDevice->null_device.operationResult = MA_SUCCESS;
            ma_event_signal(&pDevice->null_device.operationCompletionEvent);
            ma_semaphore_release(&pDevice->null_device.operationSemaphore);
            continue;
        }

        /* Suspending the device means we need to stop the timer and just continue the loop. */
        if (operation == MA_DEVICE_OP_SUSPEND__NULL) {
            /* We need to add the current run time to the prior run time, then reset the timer. */
            pDevice->null_device.priorRunTime += ma_timer_get_time_in_seconds(&pDevice->null_device.timer);
            ma_timer_init(&pDevice->null_device.timer);

            /* We're done. */
            pDevice->null_device.operationResult = MA_SUCCESS;
            ma_event_signal(&pDevice->null_device.operationCompletionEvent);
            ma_semaphore_release(&pDevice->null_device.operationSemaphore);
            continue;
        }

        /* Killing the device means we need to get out of this loop so that this thread can terminate. */
        if (operation == MA_DEVICE_OP_KILL__NULL) {
            pDevice->null_device.operationResult = MA_SUCCESS;
            ma_event_signal(&pDevice->null_device.operationCompletionEvent);
            ma_semaphore_release(&pDevice->null_device.operationSemaphore);
            break;
        }

        /* Getting a signal on a "none" operation probably means an error. Return invalid operation. */
        if (operation == MA_DEVICE_OP_NONE__NULL) {
            MA_ASSERT(MA_FALSE);  /* <-- Trigger this in debug mode to ensure developers are aware they're doing something wrong (or there's a bug in a miniaudio). */
            pDevice->null_device.operationResult = MA_INVALID_OPERATION;
            ma_event_signal(&pDevice->null_device.operationCompletionEvent);
            ma_semaphore_release(&pDevice->null_device.operationSemaphore);
            continue;   /* Continue the loop. Don't terminate. */
        }
    }

    return (ma_thread_result)0;
}